

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMakeLocalFileName>_>::addStorage
          (Span<QHashPrivate::Node<QString,_QMakeLocalFileName>_> *this)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  ulong uVar3;
  void *pvVar4;
  uchar *puVar5;
  long in_RDI;
  size_t i_1;
  size_t i;
  Entry *newEntries;
  size_t alloc;
  Node<QString,_QMakeLocalFileName> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  if (*(char *)(in_RDI + 0x88) == '\0') {
    local_10 = 0x30;
  }
  else if (*(char *)(in_RDI + 0x88) == '0') {
    local_10 = 0x50;
  }
  else {
    local_10 = (ulong)*(byte *)(in_RDI + 0x88) + 0x10;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_10;
  uVar3 = SUB168(auVar1 * ZEXT816(0x48),0);
  if (SUB168(auVar1 * ZEXT816(0x48),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  for (local_20 = 0; local_20 < *(byte *)(in_RDI + 0x88); local_20 = local_20 + 1) {
    Entry::node((Entry *)((long)pvVar4 + local_20 * 0x48));
    Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + local_20 * 0x48));
    Node<QString,_QMakeLocalFileName>::Node
              ((Node<QString,_QMakeLocalFileName> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + local_20 * 0x48));
    Node<QString,_QMakeLocalFileName>::~Node
              ((Node<QString,_QMakeLocalFileName> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  for (local_28 = (ulong)*(byte *)(in_RDI + 0x88); local_28 < local_10; local_28 = local_28 + 1) {
    uVar2 = (char)local_28 + '\x01';
    puVar5 = Entry::nextFree((Entry *)((long)pvVar4 + local_28 * 0x48));
    *puVar5 = uVar2;
  }
  if (*(void **)(in_RDI + 0x80) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x80));
  }
  *(void **)(in_RDI + 0x80) = pvVar4;
  *(char *)(in_RDI + 0x88) = (char)local_10;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }